

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

bool __thiscall ON_XMLNodePrivate::RemoveProperty(ON_XMLNodePrivate *this,wchar_t *name)

{
  ON_XMLProperty *pOVar1;
  int iVar2;
  ON_XMLProperty **ppOVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ON_XMLProperty **ppOVar4;
  ON_XMLProperty *pOVar5;
  
  ppOVar4 = &this->m_first_property;
  ppOVar3 = ppOVar4;
  pOVar5 = (ON_XMLProperty *)0x0;
  do {
    pOVar1 = *ppOVar3;
    if (pOVar1 == (ON_XMLProperty *)0x0) {
LAB_0067cf34:
      return pOVar1 != (ON_XMLProperty *)0x0;
    }
    iVar2 = (*pOVar1->_vptr_ON_XMLProperty[2])(pOVar1);
    iVar2 = ON_wString::CompareNoCase((ON_wString *)CONCAT44(extraout_var,iVar2),name);
    if (iVar2 == 0) {
      iVar2 = (*pOVar1->_vptr_ON_XMLProperty[5])(pOVar1);
      if (pOVar5 != (ON_XMLProperty *)0x0) {
        ppOVar4 = &pOVar5->_private->_next;
      }
      *ppOVar4 = (ON_XMLProperty *)CONCAT44(extraout_var_00,iVar2);
      (*pOVar1->_vptr_ON_XMLProperty[1])(pOVar1);
      goto LAB_0067cf34;
    }
    ppOVar3 = &pOVar1->_private->_next;
    pOVar5 = pOVar1;
  } while( true );
}

Assistant:

bool ON_XMLNodePrivate::RemoveProperty(const wchar_t* name)
{
  ON_XMLProperty* pPrev = nullptr;

  auto* pProp = m_first_property;
  while (nullptr != pProp)
  {
    if (pProp->Name().CompareNoCase(name) == 0)
    {
      if (nullptr == pPrev)
      {
        m_first_property = pProp->Next();
      }
      else
      {
        pPrev->_private->_next = pProp->Next();
      }

      delete pProp;
      return true;
    }

    pPrev = pProp;
    pProp = pProp->_private->_next;
  }

  return false;
}